

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O2

int __thiscall tvm::runtime::GraphRuntime::GetInputIndex(GraphRuntime *this,string *name)

{
  pointer puVar1;
  __type _Var2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  LogMessage local_30;
  
  for (uVar4 = 0;
      puVar1 = (this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->input_nodes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
      uVar4 = uVar4 + 1) {
    _Var2 = std::operator==(&(this->nodes_).
                             super__Vector_base<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
                             ._M_impl.super__Vector_impl_data._M_start[puVar1[uVar4]].name,name);
    if (_Var2) goto LAB_0010dc18;
  }
  dmlc::LogMessage::LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
             ,0x5b);
  poVar3 = std::operator<<(local_30.log_stream_,"Warning: cannot find \"");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::operator<<(poVar3,"\" among input");
  dmlc::LogMessage::~LogMessage(&local_30);
  uVar4 = 0xffffffffffffffff;
LAB_0010dc18:
  return (int)uVar4;
}

Assistant:

int GraphRuntime::GetInputIndex(const std::string &name) {
  for (size_t i = 0; i < input_nodes_.size(); ++i) {
    uint32_t nid = input_nodes_[i];
    if (nodes_[nid].name == name) {
      return static_cast<int>(i);
    }
  }
  LOG(WARNING) << "Warning: cannot find \"" << name << "\" among input";
  return -1;
}